

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O2

pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> __thiscall
helics::CallbackFederate::operateCallback(CallbackFederate *this,iteration_time newTime)

{
  TimeRepresentation<count_time<9,_long>_> nextStep;
  Federate *this_00;
  undefined8 unaff_R12;
  ulong uVar1;
  TimeRepresentation<count_time<9,_long>_> TVar2;
  pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest> pVar3;
  iteration_time __args;
  
  __args.grantedTime = newTime.grantedTime.internalTimeCode;
  this_00 = (Federate *)
            ((long)&(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate +
            (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]);
  if (newTime.state == NEXT_STEP && __args.grantedTime.internalTimeCode == 0) {
    Federate::enteringExecutingMode(this_00,(iteration_time)ZEXT816(0));
  }
  else {
    Federate::postTimeRequestOperations(this_00,__args.grantedTime,newTime.state == ITERATING);
  }
  TVar2.internalTimeCode = 0;
  nextStep.internalTimeCode = 0x7fffffffffffffff;
  if ((this->super_CombinationFederate).super_ValueFederate.field_0x30 != '\0') {
    TVar2.internalTimeCode = 0x7fffffffffffffff;
  }
  uVar1 = CONCAT71((int7)((ulong)unaff_R12 >> 8),3);
  if (__args.grantedTime.internalTimeCode <
      *(long *)(&(this->super_CombinationFederate).super_ValueFederate.field_0x30 +
               (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]))
  {
    if (*(long *)&(this->super_CombinationFederate).super_ValueFederate.field_0x68 == 0) {
      if (*(long *)&(this->super_CombinationFederate).super_ValueFederate.field_0x88 != 0) {
        TVar2 = std::
                function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
                ::operator()((function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
                              *)&(this->super_CombinationFederate).super_ValueFederate.field_0x78,
                             __args.grantedTime.internalTimeCode);
      }
      uVar1 = 0;
      nextStep.internalTimeCode = TVar2.internalTimeCode;
    }
    else {
      __args._8_4_ = newTime._8_4_ & 0xff;
      __args._12_4_ = 0;
      pVar3 = std::
              function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
              ::operator()((function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
                            *)&(this->super_CombinationFederate).super_ValueFederate.field_0x58,
                           __args);
      nextStep = pVar3.first.internalTimeCode;
      uVar1 = (ulong)pVar3._8_4_;
      if ('\x02' < (char)pVar3.second) goto LAB_0021a296;
    }
    Federate::preTimeRequestOperations
              ((Federate *)
               ((long)&(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate +
               (long)(this->super_CombinationFederate).super_ValueFederate._vptr_ValueFederate[-3]),
               (Time)nextStep.internalTimeCode,(char)uVar1 != '\0');
  }
LAB_0021a296:
  pVar3._8_8_ = uVar1 & 0xffffffff;
  pVar3.first.internalTimeCode = nextStep.internalTimeCode;
  return pVar3;
}

Assistant:

std::pair<Time, IterationRequest> CallbackFederate::operateCallback(iteration_time newTime)
{
    if (newTime.grantedTime == timeZero && newTime.state == IterationResult::NEXT_STEP) {
        enteringExecutingMode(newTime);
    } else {
        postTimeRequestOperations(newTime.grantedTime, newTime.state == IterationResult::ITERATING);
    }
    // time zero here is equivalent to the next allowable time
    auto rval = std::make_pair((mEventTriggered) ? Time::maxVal() : timeZero,
                               IterationRequest::NO_ITERATIONS);

    if (newTime.grantedTime >= mStopTime) {
        rval = std::make_pair(Time::maxVal(), IterationRequest::HALT_OPERATIONS);
    } else if (nextTimeOperation1) {
        rval = nextTimeOperation1(newTime);
    } else if (nextTimeOperation2) {
        rval = std::make_pair(nextTimeOperation2(newTime.grantedTime),
                              IterationRequest::NO_ITERATIONS);
    }
    if (rval.second <= IterationRequest::ITERATE_IF_NEEDED) {
        preTimeRequestOperations(rval.first, rval.second != IterationRequest::NO_ITERATIONS);
    }

    return rval;
}